

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O2

void aom_wb_write_uvlc(aom_write_bit_buffer *wb,uint32_t v)

{
  ulong uVar1;
  int bits;
  
  bits = 0;
  for (uVar1 = (ulong)(v + 1); 1 < uVar1; uVar1 = uVar1 >> 1) {
    bits = bits + 1;
  }
  aom_wb_write_literal(wb,0,bits);
  aom_wb_write_unsigned_literal(wb,v + 1,bits + 1);
  return;
}

Assistant:

void aom_wb_write_uvlc(struct aom_write_bit_buffer *wb, uint32_t v) {
  int64_t shift_val = ++v;
  int leading_zeroes = 1;

  assert(shift_val > 0);

  while (shift_val >>= 1) leading_zeroes += 2;

  aom_wb_write_literal(wb, 0, leading_zeroes >> 1);
  aom_wb_write_unsigned_literal(wb, v, (leading_zeroes + 1) >> 1);
}